

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::descriptor::assign
          (descriptor *this,GLint component,GLchar *component_str,GLint location,
          GLchar *location_str,GLuint n_rows,GLchar *name)

{
  this->m_component = component;
  this->m_component_str = component_str;
  this->m_location = location;
  this->m_location_str = location_str;
  this->m_n_rows = n_rows;
  this->m_name = name;
  return;
}

Assistant:

void VaryingComponentsTest::descriptor::assign(glw::GLint component, const glw::GLchar* component_str,
											   glw::GLint location, const glw::GLchar* location_str, glw::GLuint n_rows,
											   const glw::GLchar* name)
{
	m_component		= component;
	m_component_str = component_str;
	m_location		= location;
	m_location_str  = location_str;
	m_n_rows		= n_rows;
	m_name			= name;
}